

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInByHandle(void *handle,void *tx_data_handle,uint32_t index,char **txid,uint32_t *vout,
                      uint32_t *sequence,char **script_sig)

{
  ConfidentialTransaction *this;
  char *pcVar1;
  char *pcVar2;
  CfdException *this_00;
  bool is_bitcoin;
  char *work_txid;
  Script local_228;
  undefined8 local_1f0;
  Txid temp_txid;
  Script temp_unlocking_script;
  TxInReference ref;
  
  work_txid = (char *)0x0;
  local_1f0 = 0;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ref,"TransactionData",(allocator *)&temp_unlocking_script)
  ;
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  cfd::core::Txid::Txid(&temp_txid);
  cfd::core::Script::Script(&temp_unlocking_script);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    if (is_bitcoin == true) {
      cfd::core::Transaction::GetTxIn(&ref,(Transaction *)this,index);
      cfd::core::Txid::Txid((Txid *)&local_228,&ref.super_AbstractTxInReference.txid_);
      cfd::core::Txid::operator=(&temp_txid,(Txid *)&local_228);
      cfd::core::Txid::~Txid((Txid *)&local_228);
      cfd::core::Script::Script(&local_228,&ref.super_AbstractTxInReference.unlocking_script_);
      cfd::core::Script::operator=(&temp_unlocking_script,&local_228);
      cfd::core::Script::~Script(&local_228);
      if (vout != (uint32_t *)0x0) {
        *vout = ref.super_AbstractTxInReference.vout_;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = ref.super_AbstractTxInReference.sequence_;
      }
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&ref.super_AbstractTxInReference);
    }
    else {
      cfd::core::ConfidentialTransaction::GetTxIn((ConfidentialTxInReference *)&ref,this,index);
      cfd::core::Txid::Txid((Txid *)&local_228,&ref.super_AbstractTxInReference.txid_);
      cfd::core::Txid::operator=(&temp_txid,(Txid *)&local_228);
      cfd::core::Txid::~Txid((Txid *)&local_228);
      cfd::core::Script::Script(&local_228,&ref.super_AbstractTxInReference.unlocking_script_);
      cfd::core::Script::operator=(&temp_unlocking_script,&local_228);
      cfd::core::Script::~Script(&local_228);
      if (vout != (uint32_t *)0x0) {
        *vout = ref.super_AbstractTxInReference.vout_;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = ref.super_AbstractTxInReference.sequence_;
      }
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&ref);
    }
    if (txid == (char **)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      cfd::core::Txid::GetHex_abi_cxx11_((string *)&ref,&temp_txid);
      pcVar1 = cfd::capi::CreateString((string *)&ref);
      work_txid = pcVar1;
      std::__cxx11::string::~string((string *)&ref);
    }
    if (script_sig == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&ref,&temp_unlocking_script);
      pcVar2 = cfd::capi::CreateString((string *)&ref);
      std::__cxx11::string::~string((string *)&ref);
    }
    if (pcVar1 != (char *)0x0) {
      *txid = pcVar1;
    }
    if (pcVar2 != (char *)0x0) {
      *script_sig = pcVar2;
    }
    cfd::core::Script::~Script(&temp_unlocking_script);
    cfd::core::Txid::~Txid(&temp_txid);
    return 0;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Invalid handle state. tx is null",(allocator *)&local_228);
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&ref);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** txid,
    uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Txid temp_txid;
    Script temp_unlocking_script;
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (txid != nullptr) {
      work_txid = CreateString(temp_txid.GetHex());
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(temp_unlocking_script.GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_script_sig);
  return result;
}